

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  char *string;
  char cVar2;
  _Bool _Var3;
  long *plVar4;
  undefined1 uVar5;
  long lVar6;
  CURLcode CVar7;
  char *pcVar8;
  
  pCVar1 = conn->data;
  plVar4 = (long *)(*Curl_ccalloc)(0x38,1);
  (conn->data->req).protop = plVar4;
  if (plVar4 == (long *)0x0) {
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar8 = (pCVar1->state).up.path + 1;
    plVar4[3] = (long)pcVar8;
    (pCVar1->state).slash_removed = true;
    pcVar8 = strstr(pcVar8,";type=");
    if (pcVar8 == (char *)0x0) {
      pcVar8 = strstr((conn->host).rawalloc,";type=");
    }
    if (pcVar8 != (char *)0x0) {
      *pcVar8 = '\0';
      cVar2 = Curl_raw_toupper(pcVar8[6]);
      (conn->bits).type_set = true;
      uVar5 = 1;
      lVar6 = 0xc1b;
      if (cVar2 != 'A') {
        if (cVar2 == 'D') {
          lVar6 = 0xc1d;
        }
        else {
          uVar5 = 0;
        }
      }
      *(undefined1 *)((long)pCVar1->sockets + lVar6 + -0x80) = uVar5;
    }
    *plVar4 = (long)&(conn->data->req).bytecount;
    *(undefined4 *)(plVar4 + 5) = 0;
    plVar4[6] = 0;
    pcVar8 = conn->user;
    plVar4[1] = (long)pcVar8;
    string = conn->passwd;
    plVar4[2] = (long)string;
    _Var3 = isBadFtpString(pcVar8);
    CVar7 = CURLE_URL_MALFORMAT;
    if (!_Var3) {
      _Var3 = isBadFtpString(string);
      if (!_Var3) {
        (conn->proto).ftpc.known_filesize = -1;
        CVar7 = CURLE_OK;
      }
    }
  }
  return CVar7;
}

Assistant:

static CURLcode ftp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  char *type;
  struct FTP *ftp;

  conn->data->req.protop = ftp = calloc(sizeof(struct FTP), 1);
  if(NULL == ftp)
    return CURLE_OUT_OF_MEMORY;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */
  data->state.slash_removed = TRUE; /* we've skipped the slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);
    conn->bits.type_set = TRUE;

    switch(command) {
    case 'A': /* ASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->set.ftp_list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->bytecountp = &conn->data->req.bytecount;
  ftp->transfer = FTPTRANSFER_BODY;
  ftp->downloadsize = 0;

  /* No need to duplicate user+password, the connectdata struct won't change
     during a session, but we re-init them here since on subsequent inits
     since the conn struct may have changed or been replaced.
  */
  ftp->user = conn->user;
  ftp->passwd = conn->passwd;
  if(isBadFtpString(ftp->user))
    return CURLE_URL_MALFORMAT;
  if(isBadFtpString(ftp->passwd))
    return CURLE_URL_MALFORMAT;

  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}